

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

void __thiscall wallet::SQLiteDatabase::~SQLiteDatabase(SQLiteDatabase *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~SQLiteDatabase(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0xd8);
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteDatabase::~SQLiteDatabase()
{
    Cleanup();
}